

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

void __thiscall
ot::commissioner::JoinerInfo::JoinerInfo
          (JoinerInfo *this,JoinerType aType,uint64_t aEui64,string *aPSKd,string *aProvisioningUrl)

{
  this->mType = aType;
  this->mEui64 = aEui64;
  std::__cxx11::string::string((string *)&this->mPSKd,(string *)aPSKd);
  std::__cxx11::string::string((string *)&this->mProvisioningUrl,(string *)aProvisioningUrl);
  return;
}

Assistant:

JoinerInfo::JoinerInfo(JoinerType aType, uint64_t aEui64, const std::string &aPSKd, const std::string &aProvisioningUrl)
    : mType(aType)
    , mEui64(aEui64)
    , mPSKd(aPSKd)
    , mProvisioningUrl(aProvisioningUrl)
{
}